

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_leb.c
# Opt level: O2

int dwarf_decode_signed_leb128
              (char *leb128,Dwarf_Unsigned *leb128_length,Dwarf_Signed *outval,char *endptr)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  Dwarf_Unsigned DVar7;
  uint uVar8;
  
  if (endptr <= leb128 || outval == (Dwarf_Signed *)0x0) {
    return 1;
  }
  uVar2 = 0;
  uVar8 = 1;
  uVar5 = 0;
  while( true ) {
    DVar7 = (Dwarf_Unsigned)uVar8;
    pbVar3 = (byte *)leb128;
    while( true ) {
      leb128 = (char *)(pbVar3 + 1);
      bVar1 = *pbVar3;
      uVar6 = (uint)DVar7;
      if (uVar2 < 0x40) break;
      if ((bVar1 & 0xbf) == 0) goto LAB_001bd46a;
      if ((char)(bVar1 & 0x7f) != '\0') {
        return 1;
      }
      if (0x17 < uVar6) goto LAB_001bd452;
      if (endptr <= leb128) {
        return 1;
      }
      uVar2 = uVar2 + 7;
      DVar7 = DVar7 + 1;
      pbVar3 = (byte *)leb128;
    }
    uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)uVar2 & 0x3f);
    if (-1 < (char)bVar1) break;
    if (endptr <= leb128) {
      return 1;
    }
    uVar2 = uVar2 + 7;
    uVar8 = uVar6 + 1;
    if (0x17 < uVar6) {
LAB_001bd452:
      if (leb128_length != (Dwarf_Unsigned *)0x0) {
        *leb128_length = 0x18;
      }
      return 1;
    }
  }
  uVar2 = uVar2 + 7;
LAB_001bd46a:
  uVar4 = 0x8000000000000000;
  if (uVar2 < 0x3f) {
    uVar4 = -1L << ((byte)uVar2 & 0x3f);
  }
  uVar2 = 0;
  if ((bVar1 & 0x40) != 0) {
    uVar2 = uVar4;
  }
  if (leb128_length != (Dwarf_Unsigned *)0x0) {
    *leb128_length = DVar7;
  }
  *outval = uVar2 | uVar5;
  return 0;
}

Assistant:

int
dwarf_decode_signed_leb128(char * leb128,
    Dwarf_Unsigned * leb128_length,
    Dwarf_Signed *outval,char * endptr)
{
    Dwarf_Unsigned byte   = 0;
    unsigned int   b      = 0;
    Dwarf_Signed   number = 0;
    unsigned long  shift  = 0;
    int            sign   = FALSE;
    /*  The byte_length value will be a small non-negative integer. */
    unsigned int   byte_length = 1;

    /*  byte_length being the number of bytes
        of data absorbed so far in
        turning the leb into a Dwarf_Signed. */
    if (!outval) {
        return DW_DLV_ERROR;
    }
    if (leb128 >= endptr) {
        return DW_DLV_ERROR;
    }
    byte   = *(unsigned char *)leb128;
    for (;;) {
        b = byte & 0x7f;
        if (shift >= (sizeof(number)*BITSPERBYTE)) {
            /*  Shift is large. Maybe corrupt value,
                maybe some padding high-end byte zeroes
                that we can ignore (but notice sign bit
                from the last usable byte). */
            sign =  b & 0x40;
            if (!byte || byte == 0x40) {
                /*  The value is complete. */
                break;
            }
            if (b == 0) {
                ++byte_length;
                if (byte_length > BYTESLEBMAX) {
                    /*  Erroneous input.  */
                    if (leb128_length) {
                        *leb128_length = BYTESLEBMAX;
                    }
                    return DW_DLV_ERROR;
                }
                ++leb128;
                /*  shift cannot overflow as
                    BYTESLEBMAX is not a large value */
                shift += 7;
                if (leb128 >= endptr) {
                    return DW_DLV_ERROR;
                }
                byte = *(unsigned char *)leb128;
                continue;
            }
            /*  Too big, corrupt data given the non-zero
                byte content */
            return DW_DLV_ERROR;
        }
        /*  This bit of the last byte indicates sign */
        sign =  b & 0x40;
        number |= ((Dwarf_Unsigned)b) << shift;
        shift += 7;
        if ((byte & 0x80) == 0) {
            break;
        }
        ++leb128;
        if (leb128 >= endptr) {
            return DW_DLV_ERROR;
        }
        byte = *(unsigned char *)leb128;
        byte_length++;
        if (byte_length > BYTESLEBMAX) {
            /*  Erroneous input. */
            if (leb128_length) {
                *leb128_length = BYTESLEBMAX;
            }
            return DW_DLV_ERROR;
        }
    }
    if (sign) {
        /* The following avoids undefined behavior. */
        unsigned int shiftlim = sizeof(Dwarf_Signed) * BITSPERBYTE -1;
        if (shift < shiftlim) {
            Dwarf_Signed y = (Dwarf_Signed)
                (((Dwarf_Unsigned)1) << shift);
            Dwarf_Signed x = -y;
            number |= x;
        } else if (shift == shiftlim) {
            Dwarf_Signed x= (((Dwarf_Unsigned)1) << shift);
            number |= x;
        } else {
            /* trailing zeroes case */
            Dwarf_Signed x= (((Dwarf_Unsigned)1) << shiftlim);
            number |= x;
        }
    }
    if (leb128_length) {
        *leb128_length = byte_length;
    }
    *outval = number;
    return DW_DLV_OK;
}